

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* list_files(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *folder,string *prefix)

{
  bool bVar1;
  char *__name;
  DIR *__dirp;
  long lVar2;
  dirent *pdVar3;
  allocator local_71;
  string local_70 [8];
  string filename;
  bool check_prefix;
  DIR *dir;
  dirent *entry;
  string *prefix_local;
  string *folder_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *retval;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(__return_storage_ptr__);
  __name = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(__name);
  if (__dirp != (DIR *)0x0) {
    lVar2 = std::__cxx11::string::length();
    while (pdVar3 = readdir(__dirp), pdVar3 != (dirent *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,pdVar3->d_name,&local_71);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      if ((lVar2 != 0) && (bVar1 = starts_with((string *)local_70,prefix), bVar1)) {
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_70);
      }
      std::__cxx11::string::~string(local_70);
    }
    closedir(__dirp);
  }
  return __return_storage_ptr__;
}

Assistant:

list<string> list_files(const string &folder, const string &prefix) {
    struct dirent *entry;
    list<string> retval;
    DIR *dir = opendir(folder.c_str());
    if (dir == nullptr) {
        return retval;
    }

    bool check_prefix = prefix.length() > 0;

    while ((entry = readdir(dir)) != nullptr) {
        string filename = entry->d_name;
        if (check_prefix && starts_with(filename, prefix)) {
            retval.push_back(filename);
        }
    }
    closedir(dir);

    return retval;
}